

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O3

void DUI_Init(SDL_Window *window)

{
  undefined8 uVar1;
  
  _duiWindow = window;
  _duiRenderer = (SDL_Renderer *)SDL_GetRenderer();
  _duiWindowID = SDL_GetWindowID(window);
  uVar1 = SDL_RWFromConstMem(DUI_FONT_BMP,0x4046);
  uVar1 = SDL_LoadBMP_RW(uVar1,1);
  _duiFontTexture = (SDL_Texture *)SDL_CreateTextureFromSurface(_duiRenderer,uVar1);
  SDL_FreeSurface(uVar1);
  return;
}

Assistant:

void DUI_Init(SDL_Window * window)
{
    _duiWindow = window;
    _duiRenderer = SDL_GetRenderer(window);
    _duiWindowID = SDL_GetWindowID(window);

    SDL_RWops * fontMem = SDL_RWFromConstMem(DUI_FONT_BMP, sizeof(DUI_FONT_BMP));
    SDL_Surface * fontSurface = SDL_LoadBMP_RW(fontMem, 1);

    _duiFontTexture = SDL_CreateTextureFromSurface(_duiRenderer, fontSurface);
    SDL_FreeSurface(fontSurface);
}